

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaopen_base(lua_State *L)

{
  StkId pTVar1;
  int nrec;
  
  pTVar1 = L->top;
  pTVar1->value = (L->l_gt).value;
  pTVar1->tt = (L->l_gt).tt;
  L->top = L->top + 1;
  lua_setfield(L,-0x2712,"_G");
  luaL_register(L,"_G",base_funcs);
  lua_pushlstring(L,"Lua 5.1",7);
  lua_setfield(L,-0x2712,"_VERSION");
  auxopen(L,"ipairs",luaB_ipairs,ipairsaux);
  auxopen(L,"pairs",luaB_pairs,luaB_next);
  lua_createtable(L,1,nrec);
  pTVar1 = L->top;
  pTVar1->value = pTVar1[-1].value;
  pTVar1->tt = pTVar1[-1].tt;
  L->top = L->top + 1;
  lua_setmetatable(L,-2);
  lua_pushlstring(L,"kv",2);
  lua_setfield(L,-2,"__mode");
  lua_pushcclosure(L,luaB_newproxy,1);
  lua_setfield(L,-0x2712,"newproxy");
  return 1;
}

Assistant:

static int luaopen_base(lua_State*L){
base_open(L);
return 1;
}